

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O3

void test_open_address_hashmap_simple_delete(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_err_t iVar2;
  char *expected;
  ion_status_t iVar3;
  uint uVar4;
  ulong uVar5;
  ion_hashmap_t map;
  ion_byte_t str [10];
  uint local_80;
  uint local_7c;
  ion_hashmap_t local_78;
  char local_3a [10];
  
  local_78.super.key_type = key_type_numeric_signed;
  local_78.super.compare = dictionary_compare_signed_value;
  oah_initialize(&local_78,oah_compute_simple_hash,key_type_numeric_signed,4,10,10);
  expected = (char *)malloc(10);
  local_80 = 0;
  if (0 < local_78.map_size) {
    uVar5 = 0;
    do {
      sprintf(local_3a,"%02i is key",uVar5);
      iVar3 = oah_insert(&local_78,&local_80,local_3a);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar3.error == '\0'),0x189,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00102243;
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x18a,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00102243;
      iVar3 = oah_get(&local_78,&local_80,expected);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar3.error == '\0'),0x18d,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00102243;
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x18e,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00102243;
      local_80 = local_80 + 1;
      uVar5 = (ulong)local_80;
    } while ((int)local_80 < local_78.map_size);
  }
  local_80 = 0;
  iVar3 = oah_get(&local_78,&local_80,expected);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iVar3.error == '\0'),0x193,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x194,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      local_7c = 0;
      if (0 < local_78.map_size) {
        do {
          iVar3 = oah_delete(&local_78,&local_7c);
          pVar1 = planck_unit_assert_true
                            (tc,(uint)(iVar3.error == '\0'),0x199,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar1 == '\0') goto LAB_00102243;
          pVar1 = planck_unit_assert_true
                            (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x19a,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar1 == '\0') goto LAB_00102243;
          iVar3 = oah_get(&local_78,&local_7c,expected);
          pVar1 = planck_unit_assert_true
                            (tc,(uint)(iVar3.error == '\x01'),0x19e,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar1 == '\0') goto LAB_00102243;
          pVar1 = planck_unit_assert_true
                            (tc,(uint)((ulong)iVar3 >> 0x20 == 0),0x19f,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar1 == '\0') goto LAB_00102243;
          uVar4 = local_7c + 1;
          local_80 = uVar4;
          if ((int)uVar4 < local_78.map_size) {
            do {
              iVar3 = oah_get(&local_78,&local_80,expected);
              pVar1 = planck_unit_assert_true
                                (tc,(uint)(iVar3.error == '\0'),0x1a9,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                 ,"condition was false, expected true");
              if (pVar1 == '\0') goto LAB_00102243;
              pVar1 = planck_unit_assert_true
                                (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x1aa
                                 ,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                 ,"condition was false, expected true");
              if (pVar1 == '\0') goto LAB_00102243;
              sprintf(local_3a,"%02i is key",(ulong)local_80);
              pVar1 = planck_unit_assert_str_are_equal
                                (tc,expected,local_3a,0x1b0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                );
              if (pVar1 == '\0') goto LAB_00102243;
              local_80 = local_80 + 1;
            } while ((int)local_80 < local_78.map_size);
            uVar4 = local_7c + 1;
          }
          local_7c = uVar4;
        } while ((int)uVar4 < local_78.map_size);
      }
      if (expected != (char *)0x0) {
        free(expected);
      }
      iVar2 = oah_destroy(&local_78);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar2 == '\0'),0x1bd,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 != '\0') {
        return;
      }
    }
  }
LAB_00102243:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_simple_delete(
	planck_unit_test_t *tc
) {
	/* create handler for hashmap */
	ion_hashmap_t	map;
	int				i, j;
	ion_status_t	status;

	initialize_hash_map_std_conditions(&map);

	ion_value_t value;

	value = malloc(10);

	for (i = 0; i < map.map_size; i++) {
		/* build up the value */
		ion_byte_t str[10];

		sprintf((char *) str, "%02i is key", i);
		/* this is will wrap the map*/
		status = oah_insert(&map, (&i), str);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

		status = oah_get(&map, (&i), value);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

	i		= 0;
	status	= oah_get(&map, (&i), value);
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

	for (j = 0; j < map.map_size; j++) {
		/* delete the record */
		status = oah_delete(&map, (&j));
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

		/* check to make sure that the record has been deleted */
		status = oah_get(&map, (&j), value);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_item_not_found == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 0 == status.count);

		/* and then check to make sure that the rest of the map is undisturbed */
		for (i = j + 1; i < map.map_size; i++) {
/*
			ion_value_t value;
*/
			/*value	 = malloc(10);*/

			status = oah_get(&map, &i, value);
			PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
			PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

			/* build up expected value */
			char str[10];

			sprintf(str, "%02i is key", i);
			PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, str);

			/*if (value != NULL) {
				free(value);
			}*/
		}
	}

	/* must free value after query */
	if (value != NULL) {
		free(value);
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}